

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexPermuteTwo(Abc_Cex_t *p,Vec_Int_t *vPermOld,Vec_Int_t *vPermNew)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *vMapOld2New;
  int *__s;
  Abc_Cex_t *pAVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = p->nPis;
  if (vPermOld->nSize != iVar1) {
    __assert_fail("Vec_IntSize(vPermOld) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x208,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vPermNew->nSize != iVar1) {
    __assert_fail("Vec_IntSize(vPermNew) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x209,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  vMapOld2New = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  vMapOld2New->nSize = 0;
  vMapOld2New->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  vMapOld2New->pArray = __s;
  vMapOld2New->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  iVar5 = vPermOld->nSize;
  if (0 < (long)iVar5) {
    piVar3 = vPermOld->pArray;
    uVar7 = 0;
    uVar6 = (ulong)(uint)vPermNew->nSize;
    if (vPermNew->nSize < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar6 == uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = piVar3[uVar7];
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[uVar2] = vPermNew->pArray[uVar7];
      uVar7 = uVar7 + 1;
    } while ((long)iVar5 != uVar7);
  }
  pAVar4 = Abc_CexPermute(p,vMapOld2New);
  if (__s != (int *)0x0) {
    free(__s);
    vMapOld2New->pArray = (int *)0x0;
  }
  free(vMapOld2New);
  return pAVar4;
}

Assistant:

Abc_Cex_t * Abc_CexPermuteTwo( Abc_Cex_t * p, Vec_Int_t * vPermOld, Vec_Int_t * vPermNew )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vPerm;
    int i, eOld, eNew;
    assert( Vec_IntSize(vPermOld) == p->nPis );
    assert( Vec_IntSize(vPermNew) == p->nPis );
    vPerm = Vec_IntStartFull( p->nPis );
    Vec_IntForEachEntryTwo( vPermOld, vPermNew, eOld, eNew, i )
        Vec_IntWriteEntry( vPerm, eOld, eNew );
    pCex = Abc_CexPermute( p, vPerm );
    Vec_IntFree( vPerm );
    return pCex;
}